

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void __thiscall cppcms::http::context::make_error_message(context *this,exception *e)

{
  bool bVar1;
  level_type lVar2;
  ulong uVar3;
  response *prVar4;
  cached_settings *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  long *in_RSI;
  ostringstream ss;
  trace_manip *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  exception *in_stack_fffffffffffffd78;
  int stat;
  string *this_00;
  response *in_stack_fffffffffffffd80;
  string local_220 [32];
  string local_200 [32];
  backtrace *local_1e0;
  ostringstream local_1d8 [376];
  backtrace *local_60;
  byte local_41;
  message local_40 [48];
  long *local_10;
  
  local_10 = in_RSI;
  lVar2 = booster::log::logger::instance();
  uVar3 = booster::log::logger::should_be_logged(lVar2,(char *)0x1e);
  local_41 = 0;
  if ((uVar3 & 1) != 0) {
    booster::log::message::message
              (local_40,error,"cppcms",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/http_context.cpp"
               ,0x150);
    local_41 = 1;
    poVar7 = (ostream *)booster::log::message::out();
    poVar7 = std::operator<<(poVar7,"Caught exception [");
    pcVar6 = (char *)(**(code **)(*local_10 + 0x10))();
    poVar7 = std::operator<<(poVar7,pcVar6);
    std::operator<<(poVar7,"]\n");
    local_60 = (backtrace *)booster::trace<std::exception>(in_stack_fffffffffffffd78);
    poVar7 = booster::details::operator<<
                       ((ostream *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::ios::operator_cast_to_bool(poVar7 + *(long *)(*(long *)poVar7 + -0x18));
  }
  if ((local_41 & 1) != 0) {
    booster::log::message::~message(local_40);
  }
  prVar4 = response((context *)0x3a2b0c);
  bVar1 = http::response::some_output_was_written(prVar4);
  if (!bVar1) {
    service((context *)0x3a2b26);
    pcVar5 = cppcms::service::cached_settings((service *)0x3a2b2e);
    if (((pcVar5->security).display_error_message & 1U) == 0) {
      prVar4 = response((context *)0x3a2c9a);
      this_00 = local_220;
      std::__cxx11::string::string(this_00);
      http::response::make_error_response
                (in_stack_fffffffffffffd80,(int)((ulong)this_00 >> 0x20),(string *)prVar4);
      std::__cxx11::string::~string(local_220);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1d8);
      pcVar6 = (char *)(**(code **)(*local_10 + 0x10))();
      poVar7 = std::operator<<((ostream *)local_1d8,pcVar6);
      std::operator<<(poVar7,'\n');
      local_1e0 = (backtrace *)booster::trace<std::exception>(in_stack_fffffffffffffd78);
      stat = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
      booster::details::operator<<((ostream *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      prVar4 = response((context *)0x3a2bc2);
      std::__cxx11::ostringstream::str();
      http::response::make_error_response(prVar4,stat,in_stack_fffffffffffffd70);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::ostringstream::~ostringstream(local_1d8);
    }
  }
  return;
}

Assistant:

void context::make_error_message(std::exception const &e)
{
	BOOSTER_ERROR("cppcms") << "Caught exception ["<<e.what()<<"]\n" << booster::trace(e)  ;
	if(!response().some_output_was_written()) {
		if(service().cached_settings().security.display_error_message) {
			std::ostringstream ss;
			ss << e.what() << '\n';
			ss << booster::trace(e);
			response().make_error_response(http::response::internal_server_error,ss.str());
		}
		else
			response().make_error_response(http::response::internal_server_error);
	}
}